

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

int symamd(int n,int *A,int *p,int *perm,double *knobs,int *stats,
          _func_void_ptr_size_t_size_t *allocate,_func_void_void_ptr *release)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  int *A_00;
  undefined1 auVar7 [16];
  double local_1c8;
  double default_knobs [20];
  double cknobs [20];
  int local_78;
  int length;
  int last_row;
  int pp;
  int mnz;
  int k;
  int j;
  int i;
  int nnz;
  int n_row;
  size_t Mlen;
  int *M;
  int *mark;
  int *count;
  int *stats_local;
  double *knobs_local;
  int *perm_local;
  int *p_local;
  int *A_local;
  int n_local;
  
  if (stats == (int *)0x0) {
    A_local._4_4_ = 0;
  }
  else {
    for (k = 0; k < 0x14; k = k + 1) {
      stats[k] = 0;
    }
    stats[3] = 0;
    stats[4] = -1;
    stats[5] = -1;
    if (A == (int *)0x0) {
      stats[3] = -1;
      A_local._4_4_ = 0;
    }
    else if (p == (int *)0x0) {
      stats[3] = -2;
      A_local._4_4_ = 0;
    }
    else if (n < 0) {
      stats[3] = -4;
      stats[4] = n;
      A_local._4_4_ = 0;
    }
    else {
      iVar3 = p[n];
      if (iVar3 < 0) {
        stats[3] = -5;
        stats[4] = iVar3;
        A_local._4_4_ = 0;
      }
      else if (*p == 0) {
        stats_local = (int *)knobs;
        if (knobs == (double *)0x0) {
          colamd_set_defaults(&local_1c8);
          stats_local = (int *)&local_1c8;
        }
        auVar7 = (undefined1  [16])(*allocate)((long)(n + 1),4);
        pvVar4 = auVar7._0_8_;
        if (pvVar4 == (void *)0x0) {
          stats[3] = -10;
          A_local._4_4_ = 0;
        }
        else {
          pvVar5 = (*allocate)((long)(n + 1),4);
          if (pvVar5 == (void *)0x0) {
            stats[3] = -10;
            (*release)(pvVar4);
            A_local._4_4_ = 0;
          }
          else {
            stats[6] = 0;
            for (k = 0; k < n; k = k + 1) {
              *(undefined4 *)((long)pvVar5 + (long)k * 4) = 0xffffffff;
            }
            for (mnz = 0; mnz < n; mnz = mnz + 1) {
              local_78 = -1;
              iVar3 = p[mnz + 1];
              iVar1 = p[mnz];
              if (iVar3 - iVar1 < 0) {
                stats[3] = -8;
                stats[4] = mnz;
                stats[5] = iVar3 - iVar1;
                (*release)(pvVar4);
                (*release)(pvVar5);
                return 0;
              }
              for (length = p[mnz]; length < p[mnz + 1]; length = length + 1) {
                iVar3 = A[length];
                if ((iVar3 < 0) || (n <= iVar3)) {
                  stats[3] = -9;
                  stats[4] = mnz;
                  stats[5] = iVar3;
                  stats[6] = n;
                  (*release)(pvVar4);
                  (*release)(pvVar5);
                  return 0;
                }
                if ((iVar3 <= local_78) || (*(int *)((long)pvVar5 + (long)iVar3 * 4) == mnz)) {
                  stats[3] = 1;
                  stats[4] = mnz;
                  stats[5] = iVar3;
                  stats[6] = stats[6] + 1;
                }
                if ((mnz < iVar3) && (*(int *)((long)pvVar5 + (long)iVar3 * 4) != mnz)) {
                  *(int *)((long)pvVar4 + (long)iVar3 * 4) =
                       *(int *)((long)pvVar4 + (long)iVar3 * 4) + 1;
                  *(int *)((long)pvVar4 + (long)mnz * 4) =
                       *(int *)((long)pvVar4 + (long)mnz * 4) + 1;
                }
                *(int *)((long)pvVar5 + (long)iVar3 * 4) = mnz;
                local_78 = iVar3;
              }
            }
            *perm = 0;
            for (mnz = 1; mnz <= n; mnz = mnz + 1) {
              perm[mnz] = perm[mnz + -1] + *(int *)((long)pvVar4 + (long)(mnz + -1) * 4);
            }
            for (mnz = 0; mnz < n; mnz = mnz + 1) {
              *(int *)((long)pvVar4 + (long)mnz * 4) = perm[mnz];
            }
            iVar3 = perm[n] / 2;
            sVar6 = colamd_recommended(perm[n],iVar3,n);
            A_00 = (int *)(*allocate)(sVar6,4);
            if (A_00 == (int *)0x0) {
              stats[3] = -10;
              (*release)(pvVar4);
              (*release)(pvVar5);
              A_local._4_4_ = 0;
            }
            else {
              pp = 0;
              if (stats[3] == 0) {
                for (mnz = 0; mnz < n; mnz = mnz + 1) {
                  for (length = p[mnz]; length < p[mnz + 1]; length = length + 1) {
                    iVar1 = A[length];
                    if (mnz < iVar1) {
                      iVar2 = *(int *)((long)pvVar4 + (long)iVar1 * 4);
                      *(int *)((long)pvVar4 + (long)iVar1 * 4) = iVar2 + 1;
                      A_00[iVar2] = pp;
                      iVar1 = *(int *)((long)pvVar4 + (long)mnz * 4);
                      *(int *)((long)pvVar4 + (long)mnz * 4) = iVar1 + 1;
                      A_00[iVar1] = pp;
                      pp = pp + 1;
                    }
                  }
                }
              }
              else {
                for (k = 0; k < n; k = k + 1) {
                  *(undefined4 *)((long)pvVar5 + (long)k * 4) = 0xffffffff;
                }
                for (mnz = 0; mnz < n; mnz = mnz + 1) {
                  for (length = p[mnz]; length < p[mnz + 1]; length = length + 1) {
                    iVar1 = A[length];
                    if ((mnz < iVar1) && (*(int *)((long)pvVar5 + (long)iVar1 * 4) != mnz)) {
                      iVar2 = *(int *)((long)pvVar4 + (long)iVar1 * 4);
                      *(int *)((long)pvVar4 + (long)iVar1 * 4) = iVar2 + 1;
                      A_00[iVar2] = pp;
                      iVar2 = *(int *)((long)pvVar4 + (long)mnz * 4);
                      *(int *)((long)pvVar4 + (long)mnz * 4) = iVar2 + 1;
                      A_00[iVar2] = pp;
                      pp = pp + 1;
                      *(int *)((long)pvVar5 + (long)iVar1 * 4) = mnz;
                    }
                  }
                }
              }
              (*release)(pvVar4);
              (*release)(pvVar5);
              for (k = 0; k < 0x14; k = k + 1) {
                default_knobs[(long)k + 0x13] = *(double *)(stats_local + (long)k * 2);
              }
              default_knobs[0x13] = -1.0;
              colamd(iVar3,n,(int)sVar6,A_00,perm,default_knobs + 0x13,stats);
              *stats = stats[1];
              (*release)(A_00);
              A_local._4_4_ = 1;
            }
          }
        }
      }
      else {
        stats[3] = -6;
        stats[4] = *p;
        A_local._4_4_ = 0;
      }
    }
  }
  return A_local._4_4_;
}

Assistant:

PUBLIC Int SYMAMD_MAIN			/* return TRUE if OK, FALSE otherwise */
(
    /* === Parameters ======================================================= */

    Int n,				/* number of rows and columns of A */
    Int A [],				/* row indices of A */
    Int p [],				/* column pointers of A */
    Int perm [],			/* output permutation, size n+1 */
    double knobs [COLAMD_KNOBS],	/* parameters (uses defaults if NULL) */
    Int stats [COLAMD_STATS],		/* output statistics and error codes */
    void * (*allocate) (size_t, size_t),
    					/* pointer to calloc (ANSI C) or */
					/* mxCalloc (for MATLAB mexFunction) */
    void (*release) (void *)
    					/* pointer to free (ANSI C) or */
    					/* mxFree (for MATLAB mexFunction) */
)
{
    /* === Local variables ================================================== */

    Int *count ;		/* length of each column of M, and col pointer*/
    Int *mark ;			/* mark array for finding duplicate entries */
    Int *M ;			/* row indices of matrix M */
    size_t Mlen ;		/* length of M */
    Int n_row ;			/* number of rows in M */
    Int nnz ;			/* number of entries in A */
    Int i ;			/* row index of A */
    Int j ;			/* column index of A */
    Int k ;			/* row index of M */ 
    Int mnz ;			/* number of nonzeros in M */
    Int pp ;			/* index into a column of A */
    Int last_row ;		/* last row seen in the current column */
    Int length ;		/* number of nonzeros in a column */

    double cknobs [COLAMD_KNOBS] ;		/* knobs for colamd */
    double default_knobs [COLAMD_KNOBS] ;	/* default knobs for colamd */

#ifndef NDEBUG
    colamd_get_debug ("symamd") ;
#endif /* NDEBUG */

    /* === Check the input arguments ======================================== */

    if (!stats)
    {
	DEBUG0 (("symamd: stats not present\n")) ;
	return (FALSE) ;
    }
    for (i = 0 ; i < COLAMD_STATS ; i++)
    {
	stats [i] = 0 ;
    }
    stats [COLAMD_STATUS] = COLAMD_OK ;
    stats [COLAMD_INFO1] = -1 ;
    stats [COLAMD_INFO2] = -1 ;

    if (!A)
    {
    	stats [COLAMD_STATUS] = COLAMD_ERROR_A_not_present ;
	DEBUG0 (("symamd: A not present\n")) ;
	return (FALSE) ;
    }

    if (!p)		/* p is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p_not_present ;
	DEBUG0 (("symamd: p not present\n")) ;
    	return (FALSE) ;
    }

    if (n < 0)		/* n must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_ncol_negative ;
	stats [COLAMD_INFO1] = n ;
	DEBUG0 (("symamd: n negative %d\n", n)) ;
    	return (FALSE) ;
    }

    nnz = p [n] ;
    if (nnz < 0)	/* nnz must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nnz_negative ;
	stats [COLAMD_INFO1] = nnz ;
	DEBUG0 (("symamd: number of entries negative %d\n", nnz)) ;
	return (FALSE) ;
    }

    if (p [0] != 0)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p0_nonzero ;
	stats [COLAMD_INFO1] = p [0] ;
	DEBUG0 (("symamd: p[0] not zero %d\n", p [0])) ;
	return (FALSE) ;
    }

    /* === If no knobs, set default knobs =================================== */

    if (!knobs)
    {
	COLAMD_set_defaults (default_knobs) ;
	knobs = default_knobs ;
    }

    /* === Allocate count and mark ========================================== */

    count = (Int *) ((*allocate) (n+1, sizeof (Int))) ;
    if (!count)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	DEBUG0 (("symamd: allocate count (size %d) failed\n", n+1)) ;
	return (FALSE) ;
    }

    mark = (Int *) ((*allocate) (n+1, sizeof (Int))) ;
    if (!mark)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	(*release) ((void *) count) ;
	DEBUG0 (("symamd: allocate mark (size %d) failed\n", n+1)) ;
	return (FALSE) ;
    }

    /* === Compute column counts of M, check if A is valid ================== */

    stats [COLAMD_INFO3] = 0 ;  /* number of duplicate or unsorted row indices*/

    for (i = 0 ; i < n ; i++)
    {
    	mark [i] = -1 ;
    }

    for (j = 0 ; j < n ; j++)
    {
	last_row = -1 ;

	length = p [j+1] - p [j] ;
	if (length < 0)
	{
	    /* column pointers must be non-decreasing */
	    stats [COLAMD_STATUS] = COLAMD_ERROR_col_length_negative ;
	    stats [COLAMD_INFO1] = j ;
	    stats [COLAMD_INFO2] = length ;
	    (*release) ((void *) count) ;
	    (*release) ((void *) mark) ;
	    DEBUG0 (("symamd: col %d negative length %d\n", j, length)) ;
	    return (FALSE) ;
	}

	for (pp = p [j] ; pp < p [j+1] ; pp++)
	{
	    i = A [pp] ;
	    if (i < 0 || i >= n)
	    {
		/* row index i, in column j, is out of bounds */
		stats [COLAMD_STATUS] = COLAMD_ERROR_row_index_out_of_bounds ;
		stats [COLAMD_INFO1] = j ;
		stats [COLAMD_INFO2] = i ;
		stats [COLAMD_INFO3] = n ;
		(*release) ((void *) count) ;
		(*release) ((void *) mark) ;
		DEBUG0 (("symamd: row %d col %d out of bounds\n", i, j)) ;
		return (FALSE) ;
	    }

	    if (i <= last_row || mark [i] == j)
	    {
		/* row index is unsorted or repeated (or both), thus col */
		/* is jumbled.  This is a notice, not an error condition. */
		stats [COLAMD_STATUS] = COLAMD_OK_BUT_JUMBLED ;
		stats [COLAMD_INFO1] = j ;
		stats [COLAMD_INFO2] = i ;
		(stats [COLAMD_INFO3]) ++ ;
		DEBUG1 (("symamd: row %d col %d unsorted/duplicate\n", i, j)) ;
	    }

	    if (i > j && mark [i] != j)
	    {
		/* row k of M will contain column indices i and j */
		count [i]++ ;
		count [j]++ ;
	    }

	    /* mark the row as having been seen in this column */
	    mark [i] = j ;

	    last_row = i ;
	}
    }

    /* v2.4: removed free(mark) */

    /* === Compute column pointers of M ===================================== */

    /* use output permutation, perm, for column pointers of M */
    perm [0] = 0 ;
    for (j = 1 ; j <= n ; j++)
    {
	perm [j] = perm [j-1] + count [j-1] ;
    }
    for (j = 0 ; j < n ; j++)
    {
	count [j] = perm [j] ;
    }

    /* === Construct M ====================================================== */

    mnz = perm [n] ;
    n_row = mnz / 2 ;
    Mlen = COLAMD_recommended (mnz, n_row, n) ;
    M = (Int *) ((*allocate) (Mlen, sizeof (Int))) ;
    DEBUG0 (("symamd: M is %d-by-%d with %d entries, Mlen = %g\n",
    	n_row, n, mnz, (double) Mlen)) ;

    if (!M)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_out_of_memory ;
	(*release) ((void *) count) ;
	(*release) ((void *) mark) ;
	DEBUG0 (("symamd: allocate M (size %g) failed\n", (double) Mlen)) ;
	return (FALSE) ;
    }

    k = 0 ;

    if (stats [COLAMD_STATUS] == COLAMD_OK)
    {
	/* Matrix is OK */
	for (j = 0 ; j < n ; j++)
	{
	    ASSERT (p [j+1] - p [j] >= 0) ;
	    for (pp = p [j] ; pp < p [j+1] ; pp++)
	    {
		i = A [pp] ;
		ASSERT (i >= 0 && i < n) ;
		if (i > j)
		{
		    /* row k of M contains column indices i and j */
		    M [count [i]++] = k ;
		    M [count [j]++] = k ;
		    k++ ;
		}
	    }
	}
    }
    else
    {
	/* Matrix is jumbled.  Do not add duplicates to M.  Unsorted cols OK. */
	DEBUG0 (("symamd: Duplicates in A.\n")) ;
	for (i = 0 ; i < n ; i++)
	{
	    mark [i] = -1 ;
	}
	for (j = 0 ; j < n ; j++)
	{
	    ASSERT (p [j+1] - p [j] >= 0) ;
	    for (pp = p [j] ; pp < p [j+1] ; pp++)
	    {
		i = A [pp] ;
		ASSERT (i >= 0 && i < n) ;
		if (i > j && mark [i] != j)
		{
		    /* row k of M contains column indices i and j */
		    M [count [i]++] = k ;
		    M [count [j]++] = k ;
		    k++ ;
		    mark [i] = j ;
		}
	    }
	}
	/* v2.4: free(mark) moved below */
    }

    /* count and mark no longer needed */
    (*release) ((void *) count) ;
    (*release) ((void *) mark) ;	/* v2.4: free (mark) moved here */
    ASSERT (k == n_row) ;

    /* === Adjust the knobs for M =========================================== */

    for (i = 0 ; i < COLAMD_KNOBS ; i++)
    {
	cknobs [i] = knobs [i] ;
    }

    /* there are no dense rows in M */
    cknobs [COLAMD_DENSE_ROW] = -1 ;
    cknobs [COLAMD_DENSE_COL] = knobs [COLAMD_DENSE_ROW] ;

    /* === Order the columns of M =========================================== */

    /* v2.4: colamd cannot fail here, so the error check is removed */
    (void) COLAMD_MAIN (n_row, n, (Int) Mlen, M, perm, cknobs, stats) ;

    /* Note that the output permutation is now in perm */

    /* === get the statistics for symamd from colamd ======================== */

    /* a dense column in colamd means a dense row and col in symamd */
    stats [COLAMD_DENSE_ROW] = stats [COLAMD_DENSE_COL] ;

    /* === Free M =========================================================== */

    (*release) ((void *) M) ;
    DEBUG0 (("symamd: done.\n")) ;
    return (TRUE) ;

}